

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O2

void sys_open(Process *proc,Args *args)

{
  ulong uVar1;
  int fd;
  path path;
  path pStack_78;
  path local_58;
  string local_38;
  
  ReadString_abi_cxx11_(&local_38,(pid_t)args->PID,args->Arg[0]);
  std::__cxx11::string::string((string *)&pStack_78,(string *)&local_38);
  Process::Normalise(&local_58,proc,&pStack_78);
  std::__cxx11::string::~string((string *)&pStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  if (-1 < args->Return) {
    uVar1 = args->Arg[1];
    fd = (int)args->Return;
    Process::MapFd(proc,fd,&local_58);
    Process::SetCloseExec(proc,fd,(bool)((byte)(uVar1 >> 0x13) & 1));
  }
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

static void sys_open(Process *proc, const Args &args)
{
  const fs::path path = proc->Normalise(ReadString(args.PID, args[0]));
  const uint64_t flags = args[1];
  const int fd = args.Return;

  if (args.Return >= 0) {
    proc->MapFd(fd, path);
    proc->SetCloseExec(fd, flags & O_CLOEXEC);
  }
}